

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O2

void __thiscall Snake::UpdateHead(Snake *this)

{
  float fVar1;
  __type _Var2;
  
  switch(*(undefined4 *)this) {
  case 0:
    fVar1 = *(float *)(this + 0x14) - *(float *)(this + 4);
    break;
  case 1:
    fVar1 = *(float *)(this + 4) + *(float *)(this + 0x14);
    break;
  case 2:
    fVar1 = *(float *)(this + 0x10) - *(float *)(this + 4);
    goto LAB_00105d9e;
  case 3:
    fVar1 = *(float *)(this + 4) + *(float *)(this + 0x10);
LAB_00105d9e:
    *(float *)(this + 0x10) = fVar1;
  default:
    goto switchD_00105d7a_default;
  }
  *(float *)(this + 0x14) = fVar1;
switchD_00105d7a_default:
  _Var2 = std::fmod<float,int>
                    ((float)*(int *)(this + 0x34) + *(float *)(this + 0x10),*(int *)(this + 0x34));
  *(float *)(this + 0x10) = (float)_Var2;
  _Var2 = std::fmod<float,int>
                    ((float)*(int *)(this + 0x38) + *(float *)(this + 0x14),*(int *)(this + 0x38));
  *(float *)(this + 0x14) = (float)_Var2;
  return;
}

Assistant:

void Snake::UpdateHead() {
  switch (direction) {
    case Direction::kUp:
      head_y -= speed;
      break;

    case Direction::kDown:
      head_y += speed;
      break;

    case Direction::kLeft:
      head_x -= speed;
      break;

    case Direction::kRight:
      head_x += speed;
      break;
  }

  // Wrap the Snake around to the beginning if going off of the screen.
  head_x = fmod(head_x + grid_width, grid_width);
  head_y = fmod(head_y + grid_height, grid_height);
}